

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  long lVar9;
  uint uVar10;
  ulong *puVar11;
  uint uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  seqDef *psVar17;
  ulong *puVar18;
  int iVar19;
  long lVar20;
  ulong *puVar21;
  uint uVar22;
  uint uVar23;
  BYTE *pStart_3;
  uint uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  BYTE *pBVar30;
  uint uVar31;
  U32 UVar32;
  long lVar33;
  BYTE *pBVar34;
  long lVar35;
  uint uVar36;
  ulong *puVar37;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  ulong local_d0;
  uint local_64;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar28 = (ulong *)((long)src + (srcSize - 8));
  pBVar34 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar37 = (ulong *)((ulong)(pBVar34 == (BYTE *)src) + (long)src);
  uVar31 = (int)puVar37 - (int)pBVar34;
  uVar22 = uVar5;
  if (uVar31 < uVar5) {
    uVar22 = 0;
  }
  uVar25 = (ulong)uVar22;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar16 = (ulong)uVar6;
  if (uVar31 < uVar6) {
    uVar16 = 0;
  }
  uVar23 = (uint)uVar16;
  if (puVar37 < puVar28) {
    puVar1 = (ulong *)((long)puVar4 - 7);
    puVar2 = (ulong *)((long)puVar4 - 3);
    puVar3 = (ulong *)((long)puVar4 - 1);
    do {
      local_64 = (uint)uVar25;
      uVar22 = (uint)uVar16;
      lVar35 = -uVar16;
      if (uVar22 == 0) {
        uVar27 = 0;
      }
      else {
        uVar27 = 0;
        if (*(int *)((long)puVar37 + 1) == *(int *)((long)((long)puVar37 + 1U) - uVar16)) {
          puVar18 = (ulong *)((long)puVar37 + 5);
          puVar13 = (ulong *)((long)puVar37 + lVar35 + 5);
          puVar26 = puVar18;
          if (puVar18 < puVar1) {
            if (*puVar13 == *puVar18) {
              lVar20 = 0;
              do {
                puVar26 = (ulong *)((long)puVar37 + lVar20 + 0xd);
                if (puVar1 <= puVar26) {
                  puVar13 = (ulong *)((long)puVar37 + lVar35 + lVar20 + 0xd);
                  puVar26 = (ulong *)((long)puVar37 + lVar20 + 0xd);
                  goto LAB_0019280a;
                }
                uVar27 = *(ulong *)((long)puVar37 + lVar20 + lVar35 + 0xd);
                uVar29 = *puVar26;
                lVar20 = lVar20 + 8;
              } while (uVar27 == uVar29);
              uVar29 = uVar29 ^ uVar27;
              uVar27 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar20;
            }
            else {
              uVar29 = *puVar18 ^ *puVar13;
              uVar27 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = uVar27 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0019280a:
            if ((puVar26 < puVar2) && ((int)*puVar13 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar13 = (ulong *)((long)puVar13 + 4);
            }
            if ((puVar26 < puVar3) && ((short)*puVar13 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar13 = (ulong *)((long)puVar13 + 2);
            }
            if (puVar26 < puVar4) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar13 == (char)*puVar26));
            }
            uVar27 = (long)puVar26 - (long)puVar18;
          }
          uVar27 = uVar27 + 4;
        }
      }
      UVar32 = (U32)puVar37;
      if (cParams->searchLength - 6 < 2) {
        pUVar8 = ms->chainTable;
        uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar30 = (ms->window).base;
        uVar23 = (ms->window).lowLimit;
        uVar24 = UVar32 - (int)pBVar30;
        uVar12 = uVar24 - uVar36;
        if (uVar24 < uVar36) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar32);
        if (uVar23 < uVar10) {
          iVar19 = 1 << ((byte)uVar7 & 0x1f);
          local_d0 = 99999999;
          uVar29 = 3;
          do {
            puVar18 = (ulong *)(pBVar30 + uVar10);
            if (*(char *)(uVar29 + (long)puVar18) == *(char *)((long)puVar37 + uVar29)) {
              puVar26 = puVar37;
              if (puVar37 < puVar1) {
                if (*puVar18 == *puVar37) {
                  lVar20 = (ulong)uVar10 + 8;
                  lVar33 = 0;
                  do {
                    puVar26 = (ulong *)((long)puVar37 + lVar33 + 8);
                    if (puVar1 <= puVar26) {
                      puVar18 = (ulong *)(pBVar30 + lVar33 + lVar20);
                      goto LAB_00192996;
                    }
                    lVar9 = lVar33 + lVar20;
                    lVar33 = lVar33 + 8;
                  } while (*(ulong *)(pBVar30 + lVar9) == *puVar26);
                  uVar14 = *puVar26 ^ *(ulong *)(pBVar30 + lVar9);
                  uVar15 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar15 = (uVar15 >> 3 & 0x1fffffff) + lVar33;
                }
                else {
                  uVar14 = *puVar37 ^ *puVar18;
                  uVar15 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar15 = uVar15 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00192996:
                if ((puVar26 < puVar2) && ((int)*puVar18 == (int)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 4);
                  puVar18 = (ulong *)((long)puVar18 + 4);
                }
                if ((puVar26 < puVar3) && ((short)*puVar18 == (short)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 2);
                  puVar18 = (ulong *)((long)puVar18 + 2);
                }
                if (puVar26 < puVar4) {
                  puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar18 == (char)*puVar26));
                }
                uVar15 = (long)puVar26 - (long)puVar37;
              }
              if ((uVar29 < uVar15) &&
                 (local_d0 = (ulong)((uVar24 + 2) - uVar10), uVar29 = uVar15,
                 (ulong *)((long)puVar37 + uVar15) == puVar4)) goto LAB_00192db0;
            }
            uVar15 = uVar29;
            if ((uVar10 <= uVar12) ||
               ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
                (iVar19 = iVar19 + -1, uVar29 = uVar15, iVar19 == 0)))) goto LAB_00192db0;
          } while( true );
        }
      }
      else if (cParams->searchLength == 5) {
        pUVar8 = ms->chainTable;
        uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar30 = (ms->window).base;
        uVar23 = (ms->window).lowLimit;
        uVar24 = UVar32 - (int)pBVar30;
        uVar12 = uVar24 - uVar36;
        if (uVar24 < uVar36) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar32);
        if (uVar23 < uVar10) {
          iVar19 = 1 << ((byte)uVar7 & 0x1f);
          local_d0 = 99999999;
          uVar29 = 3;
          do {
            puVar18 = (ulong *)(pBVar30 + uVar10);
            if (*(char *)(uVar29 + (long)puVar18) == *(char *)((long)puVar37 + uVar29)) {
              puVar26 = puVar37;
              if (puVar37 < puVar1) {
                if (*puVar18 == *puVar37) {
                  lVar20 = (ulong)uVar10 + 8;
                  lVar33 = 0;
                  do {
                    puVar26 = (ulong *)((long)puVar37 + lVar33 + 8);
                    if (puVar1 <= puVar26) {
                      puVar18 = (ulong *)(pBVar30 + lVar33 + lVar20);
                      goto LAB_00192b56;
                    }
                    lVar9 = lVar33 + lVar20;
                    lVar33 = lVar33 + 8;
                  } while (*(ulong *)(pBVar30 + lVar9) == *puVar26);
                  uVar14 = *puVar26 ^ *(ulong *)(pBVar30 + lVar9);
                  uVar15 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar15 = (uVar15 >> 3 & 0x1fffffff) + lVar33;
                }
                else {
                  uVar14 = *puVar37 ^ *puVar18;
                  uVar15 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar15 = uVar15 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00192b56:
                if ((puVar26 < puVar2) && ((int)*puVar18 == (int)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 4);
                  puVar18 = (ulong *)((long)puVar18 + 4);
                }
                if ((puVar26 < puVar3) && ((short)*puVar18 == (short)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 2);
                  puVar18 = (ulong *)((long)puVar18 + 2);
                }
                if (puVar26 < puVar4) {
                  puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar18 == (char)*puVar26));
                }
                uVar15 = (long)puVar26 - (long)puVar37;
              }
              if ((uVar29 < uVar15) &&
                 (local_d0 = (ulong)((uVar24 + 2) - uVar10), uVar29 = uVar15,
                 (ulong *)((long)puVar37 + uVar15) == puVar4)) goto LAB_00192db0;
            }
            uVar15 = uVar29;
            if ((uVar10 <= uVar12) ||
               ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
                (iVar19 = iVar19 + -1, uVar29 = uVar15, iVar19 == 0)))) goto LAB_00192db0;
          } while( true );
        }
      }
      else {
        pUVar8 = ms->chainTable;
        uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar30 = (ms->window).base;
        uVar23 = (ms->window).lowLimit;
        uVar24 = UVar32 - (int)pBVar30;
        uVar12 = uVar24 - uVar36;
        if (uVar24 < uVar36) {
          uVar12 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar32);
        if (uVar23 < uVar10) {
          iVar19 = 1 << ((byte)uVar7 & 0x1f);
          local_d0 = 99999999;
          uVar29 = 3;
          do {
            puVar18 = (ulong *)(pBVar30 + uVar10);
            if (*(char *)(uVar29 + (long)puVar18) == *(char *)((long)puVar37 + uVar29)) {
              puVar26 = puVar37;
              if (puVar37 < puVar1) {
                if (*puVar18 == *puVar37) {
                  lVar20 = (ulong)uVar10 + 8;
                  lVar33 = 0;
                  do {
                    puVar26 = (ulong *)((long)puVar37 + lVar33 + 8);
                    if (puVar1 <= puVar26) {
                      puVar18 = (ulong *)(pBVar30 + lVar33 + lVar20);
                      goto LAB_00192d0e;
                    }
                    lVar9 = lVar33 + lVar20;
                    lVar33 = lVar33 + 8;
                  } while (*(ulong *)(pBVar30 + lVar9) == *puVar26);
                  uVar14 = *puVar26 ^ *(ulong *)(pBVar30 + lVar9);
                  uVar15 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar15 = (uVar15 >> 3 & 0x1fffffff) + lVar33;
                }
                else {
                  uVar14 = *puVar37 ^ *puVar18;
                  uVar15 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar15 = uVar15 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00192d0e:
                if ((puVar26 < puVar2) && ((int)*puVar18 == (int)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 4);
                  puVar18 = (ulong *)((long)puVar18 + 4);
                }
                if ((puVar26 < puVar3) && ((short)*puVar18 == (short)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 2);
                  puVar18 = (ulong *)((long)puVar18 + 2);
                }
                if (puVar26 < puVar4) {
                  puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar18 == (char)*puVar26));
                }
                uVar15 = (long)puVar26 - (long)puVar37;
              }
              if ((uVar29 < uVar15) &&
                 (local_d0 = (ulong)((uVar24 + 2) - uVar10), uVar29 = uVar15,
                 (ulong *)((long)puVar37 + uVar15) == puVar4)) goto LAB_00192db0;
            }
            uVar15 = uVar29;
            if ((uVar10 <= uVar12) ||
               ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
                (iVar19 = iVar19 + -1, uVar29 = uVar15, iVar19 == 0)))) goto LAB_00192db0;
          } while( true );
        }
      }
      uVar15 = 3;
      local_d0 = 99999999;
LAB_00192db0:
      uVar29 = uVar27;
      if (uVar27 < uVar15) {
        uVar29 = uVar15;
      }
      if (uVar29 < 4) {
        puVar37 = (ulong *)((long)puVar37 + ((long)puVar37 - (long)src >> 8) + 1);
      }
      else {
        puVar18 = puVar37;
        if (uVar15 <= uVar27) {
          local_d0 = 0;
          puVar18 = (ulong *)((long)puVar37 + 1U);
        }
        if (puVar37 < puVar28) {
LAB_00192e2b:
          puVar26 = (ulong *)((long)puVar37 + 1);
          if (local_d0 == 0) {
            local_d0 = 0;
          }
          else if ((uVar22 != 0) && (*(int *)puVar26 == *(int *)((long)puVar26 + lVar35))) {
            puVar13 = (ulong *)((long)puVar37 + 5);
            puVar21 = (ulong *)((long)puVar37 + lVar35 + 5);
            puVar11 = puVar13;
            if (puVar13 < puVar1) {
              if (*puVar21 == *puVar13) {
                puVar11 = (ulong *)((long)puVar37 + 0xd);
                do {
                  if (puVar1 <= puVar11) {
                    puVar21 = (ulong *)((long)puVar11 + lVar35);
                    goto LAB_00192ec7;
                  }
                  puVar21 = (ulong *)((long)puVar11 + lVar35);
                  uVar25 = *puVar11;
                  puVar11 = puVar11 + 1;
                } while (*puVar21 == uVar25);
                uVar25 = uVar25 ^ *puVar21;
                uVar16 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                puVar11 = (ulong *)((long)puVar11 + ((uVar16 >> 3 & 0x1fffffff) - 8));
                goto LAB_00192f05;
              }
              uVar16 = *puVar13 ^ *puVar21;
              uVar25 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = uVar25 >> 3 & 0x1fffffff;
            }
            else {
LAB_00192ec7:
              if ((puVar11 < puVar2) && ((int)*puVar21 == (int)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 4);
                puVar21 = (ulong *)((long)puVar21 + 4);
              }
              if ((puVar11 < puVar3) && ((short)*puVar21 == (short)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 2);
                puVar21 = (ulong *)((long)puVar21 + 2);
              }
              if (puVar11 < puVar4) {
                puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar21 == (char)*puVar11));
              }
LAB_00192f05:
              uVar25 = (long)puVar11 - (long)puVar13;
              if (0xfffffffffffffffb < uVar25) goto LAB_00192f35;
            }
            uVar12 = (int)local_d0 + 1;
            uVar23 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> uVar23 == 0; uVar23 = uVar23 - 1) {
              }
            }
            if ((int)((uVar23 ^ 0x1f) + (int)uVar29 * 3 + -0x1e) < (int)(uVar25 + 4) * 3) {
              local_d0 = 0;
              puVar18 = puVar26;
              uVar29 = uVar25 + 4;
            }
          }
LAB_00192f35:
          UVar32 = (U32)puVar26;
          if (cParams->searchLength - 6 < 2) {
            pUVar8 = ms->chainTable;
            uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar30 = (ms->window).base;
            uVar23 = (ms->window).lowLimit;
            uVar24 = UVar32 - (int)pBVar30;
            uVar12 = uVar24 - uVar36;
            if (uVar24 < uVar36) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar10 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                                (BYTE *)(ulong)cParams->hashLog,UVar32);
            if (uVar23 < uVar10) {
              iVar19 = 1 << ((byte)uVar7 & 0x1f);
              uVar16 = 99999999;
              uVar25 = 3;
              do {
                puVar13 = (ulong *)(pBVar30 + uVar10);
                if (*(char *)(uVar25 + (long)puVar13) == *(char *)((long)puVar26 + uVar25)) {
                  puVar21 = puVar26;
                  if (puVar26 < puVar1) {
                    if (*puVar13 == *puVar26) {
                      lVar20 = (ulong)uVar10 + 8;
                      lVar33 = 0;
                      do {
                        puVar21 = (ulong *)((long)puVar37 + lVar33 + 9);
                        if (puVar1 <= puVar21) {
                          puVar13 = (ulong *)(pBVar30 + lVar33 + lVar20);
                          goto LAB_00193059;
                        }
                        lVar9 = lVar33 + lVar20;
                        lVar33 = lVar33 + 8;
                      } while (*(ulong *)(pBVar30 + lVar9) == *puVar21);
                      uVar15 = *puVar21 ^ *(ulong *)(pBVar30 + lVar9);
                      uVar27 = 0;
                      if (uVar15 != 0) {
                        for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar33;
                    }
                    else {
                      uVar15 = *puVar26 ^ *puVar13;
                      uVar27 = 0;
                      if (uVar15 != 0) {
                        for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar27 = uVar27 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_00193059:
                    if ((puVar21 < puVar2) && ((int)*puVar13 == (int)*puVar21)) {
                      puVar21 = (ulong *)((long)puVar21 + 4);
                      puVar13 = (ulong *)((long)puVar13 + 4);
                    }
                    if ((puVar21 < puVar3) && ((short)*puVar13 == (short)*puVar21)) {
                      puVar21 = (ulong *)((long)puVar21 + 2);
                      puVar13 = (ulong *)((long)puVar13 + 2);
                    }
                    if (puVar21 < puVar4) {
                      puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar13 == (char)*puVar21))
                      ;
                    }
                    uVar27 = (long)puVar21 - (long)puVar26;
                  }
                  if ((uVar25 < uVar27) &&
                     (uVar16 = (ulong)((uVar24 + 2) - uVar10), uVar25 = uVar27,
                     (ulong *)((long)puVar26 + uVar27) == puVar4)) goto LAB_0019340e;
                }
                uVar27 = uVar25;
                if ((uVar10 <= uVar12) ||
                   ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
                    (iVar19 = iVar19 + -1, uVar25 = uVar27, iVar19 == 0)))) goto LAB_0019340e;
              } while( true );
            }
          }
          else if (cParams->searchLength == 5) {
            pUVar8 = ms->chainTable;
            uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar30 = (ms->window).base;
            uVar23 = (ms->window).lowLimit;
            uVar24 = UVar32 - (int)pBVar30;
            uVar12 = uVar24 - uVar36;
            if (uVar24 < uVar36) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar10 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                                (BYTE *)(ulong)cParams->hashLog,UVar32);
            if (uVar23 < uVar10) {
              iVar19 = 1 << ((byte)uVar7 & 0x1f);
              uVar16 = 99999999;
              uVar25 = 3;
              do {
                puVar13 = (ulong *)(pBVar30 + uVar10);
                if (*(char *)(uVar25 + (long)puVar13) == *(char *)((long)puVar26 + uVar25)) {
                  puVar21 = puVar26;
                  if (puVar26 < puVar1) {
                    if (*puVar13 == *puVar26) {
                      lVar20 = (ulong)uVar10 + 8;
                      lVar33 = 0;
                      do {
                        puVar21 = (ulong *)((long)puVar37 + lVar33 + 9);
                        if (puVar1 <= puVar21) {
                          puVar13 = (ulong *)(pBVar30 + lVar33 + lVar20);
                          goto LAB_001931f5;
                        }
                        lVar9 = lVar33 + lVar20;
                        lVar33 = lVar33 + 8;
                      } while (*(ulong *)(pBVar30 + lVar9) == *puVar21);
                      uVar15 = *puVar21 ^ *(ulong *)(pBVar30 + lVar9);
                      uVar27 = 0;
                      if (uVar15 != 0) {
                        for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar33;
                    }
                    else {
                      uVar15 = *puVar26 ^ *puVar13;
                      uVar27 = 0;
                      if (uVar15 != 0) {
                        for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar27 = uVar27 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_001931f5:
                    if ((puVar21 < puVar2) && ((int)*puVar13 == (int)*puVar21)) {
                      puVar21 = (ulong *)((long)puVar21 + 4);
                      puVar13 = (ulong *)((long)puVar13 + 4);
                    }
                    if ((puVar21 < puVar3) && ((short)*puVar13 == (short)*puVar21)) {
                      puVar21 = (ulong *)((long)puVar21 + 2);
                      puVar13 = (ulong *)((long)puVar13 + 2);
                    }
                    if (puVar21 < puVar4) {
                      puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar13 == (char)*puVar21))
                      ;
                    }
                    uVar27 = (long)puVar21 - (long)puVar26;
                  }
                  if ((uVar25 < uVar27) &&
                     (uVar16 = (ulong)((uVar24 + 2) - uVar10), uVar25 = uVar27,
                     (ulong *)((long)puVar26 + uVar27) == puVar4)) goto LAB_0019340e;
                }
                uVar27 = uVar25;
                if ((uVar10 <= uVar12) ||
                   ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
                    (iVar19 = iVar19 + -1, uVar25 = uVar27, iVar19 == 0)))) goto LAB_0019340e;
              } while( true );
            }
          }
          else {
            pUVar8 = ms->chainTable;
            uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar30 = (ms->window).base;
            uVar23 = (ms->window).lowLimit;
            uVar24 = UVar32 - (int)pBVar30;
            uVar12 = uVar24 - uVar36;
            if (uVar24 < uVar36) {
              uVar12 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar10 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                                (BYTE *)(ulong)cParams->hashLog,UVar32);
            if (uVar23 < uVar10) {
              iVar19 = 1 << ((byte)uVar7 & 0x1f);
              uVar16 = 99999999;
              uVar25 = 3;
              do {
                puVar13 = (ulong *)(pBVar30 + uVar10);
                if (*(char *)(uVar25 + (long)puVar13) == *(char *)((long)puVar26 + uVar25)) {
                  puVar21 = puVar26;
                  if (puVar26 < puVar1) {
                    if (*puVar13 == *puVar26) {
                      lVar20 = (ulong)uVar10 + 8;
                      lVar33 = 0;
                      do {
                        puVar21 = (ulong *)((long)puVar37 + lVar33 + 9);
                        if (puVar1 <= puVar21) {
                          puVar13 = (ulong *)(pBVar30 + lVar33 + lVar20);
                          goto LAB_00193388;
                        }
                        lVar9 = lVar33 + lVar20;
                        lVar33 = lVar33 + 8;
                      } while (*(ulong *)(pBVar30 + lVar9) == *puVar21);
                      uVar15 = *puVar21 ^ *(ulong *)(pBVar30 + lVar9);
                      uVar27 = 0;
                      if (uVar15 != 0) {
                        for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar33;
                    }
                    else {
                      uVar15 = *puVar26 ^ *puVar13;
                      uVar27 = 0;
                      if (uVar15 != 0) {
                        for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar27 = uVar27 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_00193388:
                    if ((puVar21 < puVar2) && ((int)*puVar13 == (int)*puVar21)) {
                      puVar21 = (ulong *)((long)puVar21 + 4);
                      puVar13 = (ulong *)((long)puVar13 + 4);
                    }
                    if ((puVar21 < puVar3) && ((short)*puVar13 == (short)*puVar21)) {
                      puVar21 = (ulong *)((long)puVar21 + 2);
                      puVar13 = (ulong *)((long)puVar13 + 2);
                    }
                    if (puVar21 < puVar4) {
                      puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar13 == (char)*puVar21))
                      ;
                    }
                    uVar27 = (long)puVar21 - (long)puVar26;
                  }
                  if ((uVar25 < uVar27) &&
                     (uVar16 = (ulong)((uVar24 + 2) - uVar10), uVar25 = uVar27,
                     (ulong *)((long)puVar26 + uVar27) == puVar4)) goto LAB_0019340e;
                }
                uVar27 = uVar25;
                if ((uVar10 <= uVar12) ||
                   ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
                    (iVar19 = iVar19 + -1, uVar25 = uVar27, iVar19 == 0)))) goto LAB_0019340e;
              } while( true );
            }
          }
          goto LAB_00193453;
        }
LAB_00193b55:
        if (local_d0 == 0) {
          UVar32 = 1;
          uVar23 = uVar22;
        }
        else {
          if ((src < puVar18) && (pBVar34 < (BYTE *)((long)puVar18 + (2 - local_d0)))) {
            puVar37 = puVar18;
            while (puVar18 = puVar37,
                  *(char *)((long)puVar37 - 1) == *(char *)((long)puVar37 + (1 - local_d0))) {
              puVar18 = (ulong *)((long)puVar37 - 1);
              uVar29 = uVar29 + 1;
              if ((puVar18 <= src) ||
                 (pBVar30 = (BYTE *)((long)puVar37 + (1 - local_d0)), puVar37 = puVar18,
                 pBVar30 <= pBVar34)) break;
            }
          }
          UVar32 = (int)local_d0 + 1;
          uVar23 = (int)local_d0 - 2;
          local_64 = uVar22;
        }
        uVar16 = (ulong)uVar23;
        uVar25 = (long)puVar18 - (long)src;
        puVar26 = (ulong *)seqStore->lit;
        puVar37 = (ulong *)((long)puVar26 + uVar25);
        do {
          *puVar26 = *src;
          puVar26 = puVar26 + 1;
          src = (void *)((long)src + 8);
        } while (puVar26 < puVar37);
        seqStore->lit = seqStore->lit + uVar25;
        if (uVar25 < 0x10000) {
          psVar17 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar17 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar17->litLength = (U16)uVar25;
        psVar17->offset = UVar32;
        if (0xffff < uVar29 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar17->matchLength = (U16)(uVar29 - 3);
        seqStore->sequences = psVar17 + 1;
        src = (void *)((long)puVar18 + uVar29);
        uVar25 = (ulong)local_64;
        puVar37 = (ulong *)src;
        if ((local_64 != 0) && (src <= puVar28)) {
          while (uVar29 = uVar16, uVar27 = uVar25, uVar25 = uVar27, uVar16 = uVar29,
                puVar37 = (ulong *)src, (int)*src == *(int *)((long)src - uVar27)) {
            lVar35 = -uVar27;
            puVar37 = (ulong *)((long)src + 4);
            puVar26 = (ulong *)((long)src + lVar35 + 4);
            puVar18 = puVar37;
            if (puVar37 < puVar1) {
              if (*puVar26 == *puVar37) {
                lVar20 = 0;
                do {
                  puVar18 = (ulong *)((long)src + lVar20 + 0xc);
                  if (puVar1 <= puVar18) {
                    puVar26 = (ulong *)((long)src + lVar35 + lVar20 + 0xc);
                    puVar18 = (ulong *)((long)src + lVar20 + 0xc);
                    goto LAB_00193d0e;
                  }
                  uVar25 = *(ulong *)((long)src + lVar20 + lVar35 + 0xc);
                  uVar16 = *puVar18;
                  lVar20 = lVar20 + 8;
                } while (uVar25 == uVar16);
                uVar16 = uVar16 ^ uVar25;
                uVar25 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar20;
              }
              else {
                uVar16 = *puVar37 ^ *puVar26;
                uVar25 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = uVar25 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00193d0e:
              if ((puVar18 < puVar2) && ((int)*puVar26 == (int)*puVar18)) {
                puVar18 = (ulong *)((long)puVar18 + 4);
                puVar26 = (ulong *)((long)puVar26 + 4);
              }
              if ((puVar18 < puVar3) && ((short)*puVar26 == (short)*puVar18)) {
                puVar18 = (ulong *)((long)puVar18 + 2);
                puVar26 = (ulong *)((long)puVar26 + 2);
              }
              if (puVar18 < puVar4) {
                puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar26 == (char)*puVar18));
              }
              uVar25 = (long)puVar18 - (long)puVar37;
            }
            *(ulong *)seqStore->lit = *src;
            psVar17 = seqStore->sequences;
            psVar17->litLength = 0;
            psVar17->offset = 1;
            if (0xffff < uVar25 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar17->matchLength = (U16)(uVar25 + 1);
            seqStore->sequences = psVar17 + 1;
            src = (void *)((long)src + uVar25 + 4);
            uVar25 = uVar29;
            uVar16 = uVar27;
            puVar37 = (ulong *)src;
            if (((int)uVar29 == 0) || (puVar28 < src)) break;
          }
        }
      }
      uVar23 = (uint)uVar16;
      uVar22 = (uint)uVar25;
    } while (puVar37 < puVar28);
  }
  uVar12 = 0;
  if (uVar31 < uVar5) {
    uVar12 = uVar5;
  }
  if (uVar31 < uVar6) {
    uVar12 = uVar6;
  }
  if (uVar23 == 0) {
    uVar23 = uVar12;
  }
  if (uVar22 != 0) {
    uVar12 = uVar22;
  }
  *rep = uVar23;
  rep[1] = uVar12;
  return (long)puVar4 - (long)src;
LAB_0019340e:
  if (3 < uVar27) {
    uVar12 = (int)local_d0 + 1;
    uVar23 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    uVar12 = (int)uVar16 + 1;
    iVar19 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    if ((int)((uVar23 ^ 0x1f) + (int)uVar29 * 4 + -0x1b) < (int)uVar27 * 4 - iVar19)
    goto LAB_00193b19;
  }
LAB_00193453:
  if (puVar28 <= puVar26) goto LAB_00193b55;
  puVar26 = (ulong *)((long)puVar37 + 2);
  if (local_d0 == 0) {
    local_d0 = 0;
    goto LAB_00193582;
  }
  if ((uVar22 == 0) || (*(int *)puVar26 != *(int *)((long)puVar26 + lVar35))) goto LAB_00193582;
  puVar13 = (ulong *)((long)puVar37 + 6);
  puVar21 = (ulong *)((long)puVar37 + lVar35 + 6);
  puVar11 = puVar13;
  if (puVar13 < puVar1) {
    if (*puVar21 == *puVar13) {
      puVar11 = (ulong *)((long)puVar37 + 0xe);
      do {
        if (puVar1 <= puVar11) {
          puVar21 = (ulong *)((long)puVar11 + lVar35);
          goto LAB_00193512;
        }
        puVar21 = (ulong *)((long)puVar11 + lVar35);
        uVar25 = *puVar11;
        puVar11 = puVar11 + 1;
      } while (*puVar21 == uVar25);
      uVar25 = uVar25 ^ *puVar21;
      uVar16 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      puVar11 = (ulong *)((long)puVar11 + ((uVar16 >> 3 & 0x1fffffff) - 8));
      goto LAB_00193550;
    }
    uVar16 = *puVar13 ^ *puVar21;
    uVar25 = 0;
    if (uVar16 != 0) {
      for (; (uVar16 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
      }
    }
    uVar25 = uVar25 >> 3 & 0x1fffffff;
  }
  else {
LAB_00193512:
    if ((puVar11 < puVar2) && ((int)*puVar21 == (int)*puVar11)) {
      puVar11 = (ulong *)((long)puVar11 + 4);
      puVar21 = (ulong *)((long)puVar21 + 4);
    }
    if ((puVar11 < puVar3) && ((short)*puVar21 == (short)*puVar11)) {
      puVar11 = (ulong *)((long)puVar11 + 2);
      puVar21 = (ulong *)((long)puVar21 + 2);
    }
    if (puVar11 < puVar4) {
      puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar21 == (char)*puVar11));
    }
LAB_00193550:
    uVar25 = (long)puVar11 - (long)puVar13;
    if (0xfffffffffffffffb < uVar25) goto LAB_00193582;
  }
  uVar12 = (int)local_d0 + 1;
  uVar23 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> uVar23 == 0; uVar23 = uVar23 - 1) {
    }
  }
  if ((int)((uVar23 ^ 0x1f) + (int)uVar29 * 4 + -0x1e) < (int)(uVar25 + 4) * 4) {
    local_d0 = 0;
    puVar18 = puVar26;
    uVar29 = uVar25 + 4;
  }
LAB_00193582:
  UVar32 = (U32)puVar26;
  if (cParams->searchLength - 6 < 2) {
    pUVar8 = ms->chainTable;
    uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar30 = (ms->window).base;
    uVar23 = (ms->window).lowLimit;
    uVar24 = UVar32 - (int)pBVar30;
    uVar12 = uVar24 - uVar36;
    if (uVar24 < uVar36) {
      uVar12 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar32);
    if (uVar23 < uVar10) {
      iVar19 = 1 << ((byte)uVar7 & 0x1f);
      uVar16 = 99999999;
      uVar25 = 3;
      do {
        puVar13 = (ulong *)(pBVar30 + uVar10);
        if (*(char *)(uVar25 + (long)puVar13) == *(char *)((long)puVar26 + uVar25)) {
          puVar21 = puVar26;
          if (puVar26 < puVar1) {
            if (*puVar13 == *puVar26) {
              lVar20 = (ulong)uVar10 + 8;
              lVar33 = 0;
              do {
                puVar21 = (ulong *)((long)puVar37 + lVar33 + 10);
                if (puVar1 <= puVar21) {
                  puVar13 = (ulong *)(pBVar30 + lVar33 + lVar20);
                  goto LAB_001936c2;
                }
                lVar9 = lVar33 + lVar20;
                lVar33 = lVar33 + 8;
              } while (*(ulong *)(pBVar30 + lVar9) == *puVar21);
              uVar15 = *puVar21 ^ *(ulong *)(pBVar30 + lVar9);
              uVar27 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar33;
            }
            else {
              uVar15 = *puVar26 ^ *puVar13;
              uVar27 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = uVar27 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001936c2:
            if ((puVar21 < puVar2) && ((int)*puVar13 == (int)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 4);
              puVar13 = (ulong *)((long)puVar13 + 4);
            }
            if ((puVar21 < puVar3) && ((short)*puVar13 == (short)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 2);
              puVar13 = (ulong *)((long)puVar13 + 2);
            }
            if (puVar21 < puVar4) {
              puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar13 == (char)*puVar21));
            }
            uVar27 = (long)puVar21 - (long)puVar26;
          }
          if ((uVar25 < uVar27) &&
             (uVar16 = (ulong)((uVar24 + 2) - uVar10), uVar25 = uVar27,
             (ulong *)((long)puVar26 + uVar27) == puVar4)) goto LAB_00193ad6;
        }
        uVar27 = uVar25;
        if ((uVar10 <= uVar12) ||
           ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
            (iVar19 = iVar19 + -1, uVar25 = uVar27, iVar19 == 0)))) goto LAB_00193ad6;
      } while( true );
    }
  }
  else if (cParams->searchLength == 5) {
    pUVar8 = ms->chainTable;
    uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar30 = (ms->window).base;
    uVar23 = (ms->window).lowLimit;
    uVar24 = UVar32 - (int)pBVar30;
    uVar12 = uVar24 - uVar36;
    if (uVar24 < uVar36) {
      uVar12 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar32);
    if (uVar23 < uVar10) {
      iVar19 = 1 << ((byte)uVar7 & 0x1f);
      uVar16 = 99999999;
      uVar25 = 3;
      do {
        puVar13 = (ulong *)(pBVar30 + uVar10);
        if (*(char *)(uVar25 + (long)puVar13) == *(char *)((long)puVar26 + uVar25)) {
          puVar21 = puVar26;
          if (puVar26 < puVar1) {
            if (*puVar13 == *puVar26) {
              lVar20 = (ulong)uVar10 + 8;
              lVar33 = 0;
              do {
                puVar21 = (ulong *)((long)puVar37 + lVar33 + 10);
                if (puVar1 <= puVar21) {
                  puVar13 = (ulong *)(pBVar30 + lVar33 + lVar20);
                  goto LAB_0019389a;
                }
                lVar9 = lVar33 + lVar20;
                lVar33 = lVar33 + 8;
              } while (*(ulong *)(pBVar30 + lVar9) == *puVar21);
              uVar15 = *puVar21 ^ *(ulong *)(pBVar30 + lVar9);
              uVar27 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar33;
            }
            else {
              uVar15 = *puVar26 ^ *puVar13;
              uVar27 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = uVar27 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0019389a:
            if ((puVar21 < puVar2) && ((int)*puVar13 == (int)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 4);
              puVar13 = (ulong *)((long)puVar13 + 4);
            }
            if ((puVar21 < puVar3) && ((short)*puVar13 == (short)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 2);
              puVar13 = (ulong *)((long)puVar13 + 2);
            }
            if (puVar21 < puVar4) {
              puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar13 == (char)*puVar21));
            }
            uVar27 = (long)puVar21 - (long)puVar26;
          }
          if ((uVar25 < uVar27) &&
             (uVar16 = (ulong)((uVar24 + 2) - uVar10), uVar25 = uVar27,
             (ulong *)((long)puVar26 + uVar27) == puVar4)) goto LAB_00193ad6;
        }
        uVar27 = uVar25;
        if ((uVar10 <= uVar12) ||
           ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
            (iVar19 = iVar19 + -1, uVar25 = uVar27, iVar19 == 0)))) goto LAB_00193ad6;
      } while( true );
    }
  }
  else {
    pUVar8 = ms->chainTable;
    uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar30 = (ms->window).base;
    uVar23 = (ms->window).lowLimit;
    uVar24 = UVar32 - (int)pBVar30;
    uVar12 = uVar24 - uVar36;
    if (uVar24 < uVar36) {
      uVar12 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar32);
    if (uVar23 < uVar10) {
      iVar19 = 1 << ((byte)uVar7 & 0x1f);
      uVar16 = 99999999;
      uVar25 = 3;
      do {
        puVar13 = (ulong *)(pBVar30 + uVar10);
        if (*(char *)(uVar25 + (long)puVar13) == *(char *)((long)puVar26 + uVar25)) {
          puVar21 = puVar26;
          if (puVar26 < puVar1) {
            if (*puVar13 == *puVar26) {
              lVar20 = (ulong)uVar10 + 8;
              lVar33 = 0;
              do {
                puVar21 = (ulong *)((long)puVar37 + lVar33 + 10);
                if (puVar1 <= puVar21) {
                  puVar13 = (ulong *)(pBVar30 + lVar33 + lVar20);
                  goto LAB_00193a57;
                }
                lVar9 = lVar33 + lVar20;
                lVar33 = lVar33 + 8;
              } while (*(ulong *)(pBVar30 + lVar9) == *puVar21);
              uVar15 = *puVar21 ^ *(ulong *)(pBVar30 + lVar9);
              uVar27 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar33;
            }
            else {
              uVar15 = *puVar26 ^ *puVar13;
              uVar27 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = uVar27 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00193a57:
            if ((puVar21 < puVar2) && ((int)*puVar13 == (int)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 4);
              puVar13 = (ulong *)((long)puVar13 + 4);
            }
            if ((puVar21 < puVar3) && ((short)*puVar13 == (short)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 2);
              puVar13 = (ulong *)((long)puVar13 + 2);
            }
            if (puVar21 < puVar4) {
              puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar13 == (char)*puVar21));
            }
            uVar27 = (long)puVar21 - (long)puVar26;
          }
          if ((uVar25 < uVar27) &&
             (uVar16 = (ulong)((uVar24 + 2) - uVar10), uVar25 = uVar27,
             (ulong *)((long)puVar26 + uVar27) == puVar4)) goto LAB_00193ad6;
        }
        uVar27 = uVar25;
        if ((uVar10 <= uVar12) ||
           ((uVar10 = pUVar8[uVar10 & uVar36 - 1], uVar10 <= uVar23 ||
            (iVar19 = iVar19 + -1, uVar25 = uVar27, iVar19 == 0)))) goto LAB_00193ad6;
      } while( true );
    }
  }
  goto LAB_00193b55;
LAB_00193ad6:
  if (uVar27 < 4) goto LAB_00193b55;
  uVar12 = (int)local_d0 + 1;
  uVar23 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> uVar23 == 0; uVar23 = uVar23 - 1) {
    }
  }
  uVar12 = (int)uVar16 + 1;
  iVar19 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> iVar19 == 0; iVar19 = iVar19 + -1) {
    }
  }
  if ((int)uVar27 * 4 - iVar19 <= (int)((uVar23 ^ 0x1f) + (int)uVar29 * 4 + -0x18))
  goto LAB_00193b55;
LAB_00193b19:
  puVar37 = puVar26;
  puVar18 = puVar37;
  local_d0 = uVar16;
  uVar29 = uVar27;
  if (puVar28 <= puVar37) goto LAB_00193b55;
  goto LAB_00192e2b;
}

Assistant:

size_t ZSTD_compressBlock_lazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 2);
}